

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

bool __thiscall JetHead::Path::append(Path *this,string *path)

{
  ulong uVar1;
  
  uVar1 = (this->mPath)._M_string_length;
  if ((this->mPath)._M_dataplus._M_p[uVar1 - 1] != '/') {
    std::__cxx11::string::_M_replace_aux((ulong)this,uVar1,0,'\x01');
  }
  std::__cxx11::string::_M_append((char *)this,(ulong)(path->_M_dataplus)._M_p);
  return true;
}

Assistant:

bool Path::append( const JHSTD::string &path )
{
	if ( mPath[ mPath.length() - 1 ] != PATH_SEPERATOR )
		mPath.append( 1, PATH_SEPERATOR	);
		
	mPath.append( path );
	return true;
}